

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_buffered_data.cpp
# Opt level: O0

void __thiscall duckdb::SimpleBufferedData::UnblockSinks(SimpleBufferedData *this)

{
  bool bVar1;
  __int_type _Var2;
  idx_t iVar3;
  reference this_00;
  SimpleBufferedData *in_RDI;
  InterruptState *in_stack_00000010;
  value_type *blocked_sink;
  lock_guard<std::mutex> lock;
  shared_ptr<duckdb::ClientContext,_true> cc;
  mutex_type *in_stack_ffffffffffffff88;
  lock_guard<std::mutex> *in_stack_ffffffffffffff90;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffff98;
  
  weak_ptr<duckdb::ClientContext,_true>::lock((weak_ptr<duckdb::ClientContext,_true> *)in_RDI);
  bVar1 = duckdb::shared_ptr::operator_cast_to_bool
                    ((shared_ptr<duckdb::ClientContext,_true> *)0x196910b);
  if (bVar1) {
    _Var2 = ::std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff98);
    iVar3 = BufferSize(in_RDI);
    if (_Var2 < iVar3) {
      ::std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88)
      ;
      while (bVar1 = ::std::
                     queue<duckdb::InterruptState,_std::deque<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>_>
                     ::empty((queue<duckdb::InterruptState,_std::deque<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>_>
                              *)0x1969197), ((bVar1 ^ 0xffU) & 1) != 0) {
        this_00 = ::std::
                  queue<duckdb::InterruptState,_std::deque<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>_>
                  ::front((queue<duckdb::InterruptState,_std::deque<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>_>
                           *)0x19691ba);
        _Var2 = ::std::__atomic_base::operator_cast_to_unsigned_long
                          ((__atomic_base<unsigned_long> *)this_00);
        iVar3 = BufferSize(in_RDI);
        if (iVar3 <= _Var2) break;
        InterruptState::Callback(in_stack_00000010);
        ::std::
        queue<duckdb::InterruptState,_std::deque<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>_>
        ::pop((queue<duckdb::InterruptState,_std::deque<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>_>
               *)0x1969235);
      }
      ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1969246);
    }
  }
  shared_ptr<duckdb::ClientContext,_true>::~shared_ptr
            ((shared_ptr<duckdb::ClientContext,_true> *)0x1969258);
  return;
}

Assistant:

void SimpleBufferedData::UnblockSinks() {
	auto cc = context.lock();
	if (!cc) {
		return;
	}
	(void)cc;

	if (buffered_count >= BufferSize()) {
		return;
	}
	// Reschedule enough blocked sinks to populate the buffer
	lock_guard<mutex> lock(glock);
	while (!blocked_sinks.empty()) {
		auto &blocked_sink = blocked_sinks.front();
		if (buffered_count >= BufferSize()) {
			// We have unblocked enough sinks already
			break;
		}
		blocked_sink.Callback();
		blocked_sinks.pop();
	}
}